

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

bool __thiscall soul::heart::ArrayElement::readsVariable(ArrayElement *this,Variable *v)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (*(((this->parent).object)->super_Object)._vptr_Object[4])();
  bVar2 = true;
  if ((char)iVar3 == '\0') {
    pEVar1 = (this->dynamicIndex).object;
    if (pEVar1 != (Expression *)0x0) {
      iVar3 = (*(pEVar1->super_Object)._vptr_Object[4])(pEVar1,v);
      return SUB41(iVar3,0);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool readsVariable (Variable& v) const override    { return parent->readsVariable (v) || (isDynamic() && dynamicIndex->readsVariable (v)); }